

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * __thiscall
slang::ast::IntegralType::fromSyntax
          (IntegralType *this,Compilation *compilation,SyntaxKind integerKind,
          span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
          dimensions,bool isSigned,ASTContext *context)

{
  ConstantRange CVar1;
  byte bVar2;
  bitmask<slang::ast::IntegralFlags> flags;
  Type *elementType;
  Type *pTVar3;
  undefined4 in_register_00000014;
  long lVar4;
  SyntaxKind kind;
  uint width;
  undefined7 in_register_00000089;
  size_type sVar5;
  bool bVar6;
  VariableDimensionSyntax *dimSyntax;
  SmallVector<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>,_4UL>
  dims;
  EvaluatedDimension dim;
  bool local_11c;
  VariableDimensionSyntax *local_110;
  SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
  local_108 [2];
  EvaluatedDimension local_50;
  Type *ctx;
  
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  kind = (SyntaxKind)compilation;
  local_108[0].cap = 4;
  for (lVar4 = 0; (long)dimensions._M_ptr << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_110 = *(VariableDimensionSyntax **)(CONCAT44(in_register_00000014,integerKind) + lVar4);
    ASTContext::evalPackedDimension
              (&local_50,(ASTContext *)CONCAT71(in_register_00000089,isSigned),local_110);
    SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,slang::syntax::SyntaxNode_const*>>::
    emplace_back<slang::ast::EvaluatedDimension&,slang::syntax::VariableDimensionSyntax_const*&>
              ((SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,slang::syntax::SyntaxNode_const*>>
                *)local_108,&local_50,&local_110);
  }
  local_11c = dimensions._M_extent._M_extent_value._0_1_;
  if (local_108[0].len == 0) {
    ctx = (Type *)((ulong)compilation & 0xffffffff);
    elementType = Type::getPredefinedType((Compilation *)this,kind,local_11c);
  }
  else {
    bVar2 = (kind == RegType) << 2 | 2;
    if (kind == BitType) {
      bVar2 = 0;
    }
    flags.m_bits = bVar2 + local_11c;
    if (((local_108[0].len == 1) && (((local_108[0].data_)->first).kind - Range < 2)) &&
       (CVar1 = ((local_108[0].data_)->first).range, (ulong)CVar1 < 0x80000000)) {
      width = CVar1.left + 1;
      ctx = (Type *)(ulong)width;
      elementType = Compilation::getType((Compilation *)this,width,flags);
    }
    else {
      ctx = (Type *)(ulong)flags.m_bits;
      elementType = Compilation::getScalarType((Compilation *)this,flags);
      lVar4 = local_108[0].len * 0x28;
      sVar5 = local_108[0].len;
      while( true ) {
        bVar6 = sVar5 == 0;
        sVar5 = sVar5 - 1;
        if (bVar6) break;
        pTVar3 = PackedArrayType::fromSyntax
                           ((((ASTContext *)CONCAT71(in_register_00000089,isSigned))->scope).ptr,
                            elementType,
                            (EvaluatedDimension *)((long)&local_108[0].data_[-1].first.kind + lVar4)
                            ,*(SyntaxNode **)((long)&local_108[0].data_[-1].second + lVar4));
        ctx = elementType;
        lVar4 = lVar4 + -0x28;
        elementType = pTVar3;
      }
    }
  }
  SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>::
  cleanup(local_108,(EVP_PKEY_CTX *)ctx);
  return elementType;
}

Assistant:

const Type& IntegralType::fromSyntax(Compilation& compilation, SyntaxKind integerKind,
                                     std::span<const VariableDimensionSyntax* const> dimensions,
                                     bool isSigned, const ASTContext& context) {
    // This is a simple integral vector (possibly of just one element).
    SmallVector<std::pair<EvaluatedDimension, const SyntaxNode*>, 4> dims;
    for (auto dimSyntax : dimensions) {
        auto dim = context.evalPackedDimension(*dimSyntax);
        dims.emplace_back(dim, dimSyntax);
    }

    if (dims.empty())
        return getPredefinedType(compilation, integerKind, isSigned);

    bitmask<IntegralFlags> flags;
    if (integerKind == SyntaxKind::RegType)
        flags |= IntegralFlags::Reg;
    if (isSigned)
        flags |= IntegralFlags::Signed;
    if (integerKind != SyntaxKind::BitType)
        flags |= IntegralFlags::FourState;

    if (dims.size() == 1 && dims[0].first.isRange()) {
        auto range = dims[0].first.range;
        if (range.right == 0 && range.left >= 0) {
            // if we have the common case of only one dimension and lsb == 0
            // then we can use the shared representation
            return compilation.getType(range.width(), flags);
        }
    }

    const Type* result = &compilation.getScalarType(flags);
    size_t count = dims.size();
    for (size_t i = 0; i < count; i++) {
        auto& pair = dims[count - i - 1];
        result = &PackedArrayType::fromSyntax(*context.scope, *result, pair.first, *pair.second);
    }

    return *result;
}